

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirSAVEAMSDOS(void)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  aint *type;
  aint *start;
  aint *size;
  aint *address;
  bool local_4c [4];
  int iStack_48;
  bool optional [4];
  aint args [4];
  path fnaam;
  bool exec;
  
  if (DeviceID == (char *)0x0) {
    Error("SAVEAMSDOS works in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    SkipToEol(&lp);
  }
  else {
    bVar3 = pass == 3;
    GetOutputFileName_abi_cxx11_((path *)(args + 2),&lp);
    iStack_48 = -1;
    optional[0] = true;
    optional[1] = true;
    optional[2] = true;
    optional[3] = true;
    args[0] = 0;
    args[1] = 2;
    local_4c[0] = false;
    local_4c[1] = false;
    local_4c[2] = true;
    local_4c[3] = true;
    bVar1 = anyComma(&lp);
    if ((bVar1) && (bVar1 = getIntArguments<4>(&lp,(aint (*) [4])&iStack_48,&local_4c), bVar1)) {
      if ((iStack_48 < 0) || (((int)optional < 1 || (0x10000 < iStack_48 + (int)optional)))) {
        Error("[SAVEAMSDOS] [address, size] region outside of 64ki",bp,PASS3);
      }
      else {
        check16u(args[0]);
        if ((long)args._0_8_ < 0) {
          args[1] = -0x1000;
        }
        check8(args[1]);
        if (bVar3) {
          iVar2 = SaveBinaryAmsdos((path *)(args + 2),iStack_48,(aint)optional,(word)args[0],
                                   (byte)args[1]);
          if (iVar2 == 0) {
            Error("[SAVEAMSDOS] Error writing file (Disk full?)",bp,IF_FIRST);
          }
        }
      }
    }
    else {
      Error("[SAVEAMSDOS] expected syntax is <filename>,<address>,<size>[,<start = 0>[,<type = 2>]",
            bp,SUPPRESS);
    }
    std::filesystem::__cxx11::path::~path((path *)(args + 2));
  }
  return;
}

Assistant:

static void dirSAVEAMSDOS() {
	if (!DeviceID) {
		Error("SAVEAMSDOS works in real device emulation mode (See DEVICE)");
		SkipToEol(lp);
		return;
	}
	bool exec = (LASTPASS == pass);
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	aint args[] = { -1, -1, 0, 2 };	// address, size, start, type
	const bool optional[] = {false, false, true, true};
	if (!anyComma(lp) || !getIntArguments<4>(lp, args, optional)) {
		Error("[SAVEAMSDOS] expected syntax is <filename>,<address>,<size>[,<start = 0>[,<type = 2>]", bp, SUPPRESS);
		return;
	}
	aint &address = args[0], &size = args[1], &start = args[2], &type = args[3];
	if (address < 0 || size < 1 || 0x10000 < address + size) {
		Error("[SAVEAMSDOS] [address, size] region outside of 64ki", bp);
		return;
	}
	check16u(start);
	if (type < 0) type = -0x1000;		// check8 works for -256..+255 values, in this case just 0..255 is valid
	check8(type);
	if (exec && !SaveBinaryAmsdos(fnaam, address, size, start, type)) {
		Error("[SAVEAMSDOS] Error writing file (Disk full?)", bp, IF_FIRST);
	}
}